

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_proxy_call(JSContext *ctx,JSValue func_obj,JSValue this_obj,int argc,JSValue *argv,
                     int flags)

{
  int iVar1;
  JSValue new_target;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  JSValueUnion *pJVar4;
  JSValueUnion JVar5;
  uint uVar6;
  ulong uVar7;
  JSRefCountHeader *p;
  JSValue func_obj_00;
  JSValue func_obj_01;
  JSValue v;
  JSValue func_obj_02;
  JSValue v_00;
  JSValue JVar8;
  JSValue JVar9;
  JSValue JVar10;
  JSValue method;
  JSValueUnion local_88;
  int64_t local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined8 uStack_70;
  JSValueUnion local_68;
  JSValueUnion JStack_60;
  JSValue local_58;
  JSValue local_48;
  
  if ((flags & 1U) == 0) {
    pJVar4 = (JSValueUnion *)get_proxy_method(ctx,(JSValue *)&local_88,func_obj,0x5a);
    if (pJVar4 == (JSValueUnion *)0x0) {
      JVar8 = (JSValue)(ZEXT816(6) << 0x40);
      uVar7 = 0;
    }
    else {
      uVar6 = (uint)local_80;
      if (*(uint8_t *)(pJVar4 + 4) == '\0') {
        if ((0xfffffff4 < uVar6) &&
           (iVar1 = *local_88.ptr, *(int *)local_88.ptr = iVar1 + -1, iVar1 < 2)) {
          JVar10.tag = local_80;
          JVar10.u.ptr = local_88.ptr;
          __JS_FreeValueRT(ctx->rt,JVar10);
        }
        JS_ThrowTypeError(ctx,"not a function");
        uVar7 = 0;
        JVar8 = (JSValue)(ZEXT816(6) << 0x40);
      }
      else if (uVar6 == 3) {
        local_68.float64 = local_68.float64 & 0xffffffff00000000;
        JStack_60 = (JSValueUnion)0x3;
        new_target.tag._0_4_ = 3;
        new_target.u.ptr = local_68.ptr;
        new_target.tag._4_4_ = 0;
        JVar8 = JS_CallInternal(ctx,*(JSValue *)pJVar4,this_obj,new_target,argc,argv,2);
        uVar7 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
      }
      else {
        JVar10 = js_create_array(ctx,argc,argv);
        if ((uint)JVar10.tag == 6) {
          JVar8 = (JSValue)(ZEXT816(6) << 0x40);
          uVar7 = 0;
        }
        else {
          local_68 = *pJVar4;
          JStack_60 = pJVar4[1];
          local_78 = 0;
          uStack_70 = 3;
          auVar2._4_4_ = 3;
          auVar2._0_4_ = uStack_74;
          auVar2._8_8_ = 0;
          func_obj_01.tag = local_80;
          func_obj_01.u.ptr = local_88.ptr;
          local_58 = this_obj;
          local_48 = JVar10;
          JVar8 = JS_CallInternal(ctx,func_obj_01,*(JSValue *)(pJVar4 + 2),(JSValue)(auVar2 << 0x20)
                                  ,3,(JSValue *)&local_68,2);
          uVar7 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
        }
        if ((0xfffffff4 < uVar6) &&
           (iVar1 = *local_88.ptr, *(int *)local_88.ptr = iVar1 + -1, iVar1 < 2)) {
          v.tag = local_80;
          v.u.ptr = local_88.ptr;
          __JS_FreeValueRT(ctx->rt,v);
        }
        if ((0xfffffff4 < (uint)JVar10.tag) &&
           (iVar1 = *JVar10.u.ptr, *(int *)JVar10.u.ptr = iVar1 + -1, iVar1 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar10);
        }
      }
    }
    goto LAB_0012dc51;
  }
  pJVar4 = (JSValueUnion *)get_proxy_method(ctx,(JSValue *)&local_88,func_obj,0x5e);
  if (pJVar4 == (JSValueUnion *)0x0) {
LAB_0012dc48:
    JVar8 = (JSValue)(ZEXT816(6) << 0x40);
    uVar7 = 0;
  }
  else {
    if ((pJVar4[1].int32 != -1) || ((*(byte *)((long)pJVar4->ptr + 5) & 0x10) == 0)) {
      JS_ThrowTypeError(ctx,"not a constructor");
      goto LAB_0012dc48;
    }
    if ((uint)local_80 == 3) {
      func_obj_00.tag = (int64_t)pJVar4[1].ptr;
      func_obj_00.u.ptr = pJVar4->ptr;
      JVar8 = JS_CallConstructorInternal(ctx,func_obj_00,this_obj,argc,argv,2);
      uVar7 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
    }
    else {
      JVar10 = js_create_array(ctx,argc,argv);
      if ((uint)JVar10.tag == 6) {
        JVar8 = (JSValue)(ZEXT816(6) << 0x40);
        uVar7 = 0;
      }
      else {
        local_68.ptr = *(void **)pJVar4;
        JStack_60 = pJVar4[1];
        local_78 = 0;
        uStack_70 = 3;
        auVar3._4_4_ = 3;
        auVar3._0_4_ = uStack_74;
        auVar3._8_8_ = 0;
        func_obj_02.tag = local_80;
        func_obj_02.u.ptr = local_88.ptr;
        local_58 = JVar10;
        local_48 = this_obj;
        JVar8 = JS_CallInternal(ctx,func_obj_02,*(JSValue *)(pJVar4 + 2),(JSValue)(auVar3 << 0x20),3
                                ,(JSValue *)&local_68,2);
        JVar5 = JVar8.u;
        uVar7 = (ulong)JVar5.ptr & 0xffffffff00000000;
        uVar6 = (uint)JVar8.tag;
        if ((uVar6 != 0xffffffff) && (uVar6 != 6)) {
          if ((0xfffffff4 < uVar6) &&
             (iVar1 = *JVar5.ptr, *(int *)JVar5.ptr = iVar1 + -1, iVar1 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar8);
          }
          JS_ThrowTypeError(ctx,"not an object");
          uVar7 = 0;
          JVar8 = (JSValue)(ZEXT816(6) << 0x40);
        }
      }
      if ((0xfffffff4 < (uint)local_80) &&
         (iVar1 = *local_88.ptr, *(int *)local_88.ptr = iVar1 + -1, iVar1 < 2)) {
        v_00.tag = local_80;
        v_00.u.ptr = local_88.ptr;
        __JS_FreeValueRT(ctx->rt,v_00);
      }
      if ((0xfffffff4 < (uint)JVar10.tag) &&
         (iVar1 = *JVar10.u.ptr, *(int *)JVar10.u.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar10);
      }
    }
  }
  JVar8.tag = JVar8.tag;
  JVar8.u.float64 = JVar8.u.float64 | uVar7;
LAB_0012dc51:
  JVar9.tag = JVar8.tag;
  JVar9.u.ptr = (void *)((ulong)JVar8.u.ptr & 0xffffffff | uVar7);
  return JVar9;
}

Assistant:

static JSValue js_proxy_call(JSContext *ctx, JSValueConst func_obj,
                             JSValueConst this_obj,
                             int argc, JSValueConst *argv, int flags)
{
    JSProxyData *s;
    JSValue method, arg_array, ret;
    JSValueConst args[3];

    if (flags & JS_CALL_FLAG_CONSTRUCTOR)
        return js_proxy_call_constructor(ctx, func_obj, this_obj, argc, argv);
    
    s = get_proxy_method(ctx, &method, func_obj, JS_ATOM_apply);
    if (!s)
        return JS_EXCEPTION;
    if (!s->is_func) {
        JS_FreeValue(ctx, method);
        return JS_ThrowTypeError(ctx, "not a function");
    }
    if (JS_IsUndefined(method))
        return JS_Call(ctx, s->target, this_obj, argc, argv);
    arg_array = js_create_array(ctx, argc, argv);
    if (JS_IsException(arg_array)) {
        ret = JS_EXCEPTION;
        goto fail;
    }
    args[0] = s->target;
    args[1] = this_obj;
    args[2] = arg_array;
    ret = JS_Call(ctx, method, s->handler, 3, args);
 fail:
    JS_FreeValue(ctx, method);
    JS_FreeValue(ctx, arg_array);
    return ret;
}